

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridge.cpp
# Opt level: O0

bool __thiscall
despot::Bridge::Step
          (Bridge *this,State *s,double random_num,ACT_TYPE action,double *reward,OBS_TYPE *obs)

{
  State *pSVar1;
  int *position;
  bool terminal;
  BridgeState *state;
  OBS_TYPE *obs_local;
  double *reward_local;
  ACT_TYPE action_local;
  double random_num_local;
  State *s_local;
  Bridge *this_local;
  
  position._7_1_ = false;
  pSVar1 = s + 0x20;
  *obs = 1;
  if (action == LEFT) {
    *reward = -1.0;
    if (0 < *(int *)pSVar1) {
      *(int *)pSVar1 = *(int *)pSVar1 + -1;
    }
  }
  else if (action == RIGHT) {
    position._7_1_ = BRIDGELENGTH + -1 <= *(int *)pSVar1;
    if (position._7_1_) {
      *reward = 0.0;
    }
    else {
      *reward = -1.0;
      *(int *)pSVar1 = *(int *)pSVar1 + 1;
    }
  }
  else {
    *reward = (double)(-0x14 - *(int *)pSVar1);
    position._7_1_ = true;
  }
  return position._7_1_;
}

Assistant:

bool Bridge::Step(State& s, double random_num, ACT_TYPE action, double& reward,
	OBS_TYPE& obs) const {
	BridgeState& state = static_cast<BridgeState&>(s);
	bool terminal = false;
	int& position = state.position;

	obs = 1;
	if (action == LEFT) {
		reward = -1;
		if (position > 0)
			position--;
	} else if (action == RIGHT) {
		if (position < BRIDGELENGTH - 1) {
			reward = -1;
			position++;
		} else {
			reward = 0;
			terminal = true;
		}
	} else { // HELP
		reward = -20 - position;
		terminal = true;
	}
	return terminal;
}